

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O3

bool __thiscall State::AddDefault(State *this,StringPiece path,string *err)

{
  pointer *pppNVar1;
  iterator __position;
  const_iterator cVar2;
  long *plVar3;
  long *plVar4;
  size_t sVar5;
  char *pcVar6;
  Node *node;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  Node *local_50;
  key_type local_48;
  long local_38;
  long lStack_30;
  
  sVar5 = path.len_;
  pcVar6 = path.str_;
  local_48.str_ = pcVar6;
  local_48.len_ = sVar5;
  cVar2 = std::
          _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,&local_48);
  if ((cVar2.super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>._M_cur !=
       (__node_type *)0x0) &&
     (local_50 = *(Node **)((long)cVar2.
                                  super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>
                                  ._M_cur + 0x18), local_50 != (Node *)0x0)) {
    __position._M_current =
         (this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)&this->defaults_,__position,&local_50);
    }
    else {
      *__position._M_current = local_50;
      pppNVar1 = &(this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    return true;
  }
  local_90 = &local_80;
  if (sVar5 == 0) {
    local_88 = 0;
    local_80 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar6,pcVar6 + sVar5);
  }
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x12ac6f);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_38 = *plVar4;
    lStack_30 = plVar3[3];
    local_48.str_ = (char *)&local_38;
  }
  else {
    local_38 = *plVar4;
    local_48.str_ = (char *)*plVar3;
  }
  local_48.len_ = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)err,(string *)&local_48);
  if ((long *)local_48.str_ != &local_38) {
    operator_delete(local_48.str_,local_38 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return false;
}

Assistant:

bool State::AddDefault(StringPiece path, string* err) {
  Node* node = LookupNode(path);
  if (!node) {
    *err = "unknown target '" + path.AsString() + "'";
    return false;
  }
  defaults_.push_back(node);
  return true;
}